

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

TcParseTableBase *
google::protobuf::internal::TcParser::GetTableFromAux(uint16_t type_card,FieldAux aux)

{
  LogMessage *pLVar1;
  MessageLite *local_50;
  MessageLite *prototype;
  LogMessage local_30;
  Voidify local_1d;
  ushort local_1c;
  uint16_t local_1a;
  uint16_t tv;
  FieldAux FStack_18;
  uint16_t type_card_local;
  FieldAux aux_local;
  
  local_1c = type_card & 0x600;
  aux_local = aux;
  if (local_1c != 0x400) {
    local_1a = type_card;
    FStack_18 = aux;
    if (local_1c != 0x200 && local_1c != 0x600) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x9c8,"tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr");
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    if (local_1c == 0x200) {
      local_50 = TcParseTableBase::FieldAux::message_default((FieldAux *)&stack0xffffffffffffffe8);
    }
    else {
      local_50 = TcParseTableBase::FieldAux::message_default_weak
                           ((FieldAux *)&stack0xffffffffffffffe8);
    }
    aux_local.table = protobuf::MessageLite::GetTcParseTable(local_50);
  }
  return (TcParseTableBase *)aux_local.message_default_p;
}

Assistant:

inline const TcParseTableBase* TcParser::GetTableFromAux(
    uint16_t type_card, TcParseTableBase::FieldAux aux) {
  uint16_t tv = type_card & field_layout::kTvMask;
  if (ABSL_PREDICT_TRUE(tv == field_layout::kTvTable)) {
    return aux.table;
  }
  ABSL_DCHECK(tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr);
  const MessageLite* prototype = tv == field_layout::kTvDefault
                                     ? aux.message_default()
                                     : aux.message_default_weak();
  return prototype->GetTcParseTable();
}